

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON JSON::makeString(string *utf8)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  JSON JVar2;
  _Alloc_hider local_20;
  _Head_base<0UL,_JSON::JSON_value_*,_false> local_18;
  
  std::make_unique<JSON::JSON_string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  local_18._M_head_impl = (JSON_value *)local_20._M_p;
  local_20._M_p = (pointer)0x0;
  JSON((JSON *)utf8,
       (unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *)&local_18);
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_head_impl != (JSON_value *)0x0) {
    (*(local_18._M_head_impl)->_vptr_JSON_value[1])();
    _Var1._M_pi = extraout_RDX_00;
  }
  if ((long *)local_20._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_20._M_p + 8))();
    _Var1._M_pi = extraout_RDX_01;
  }
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)utf8;
  return (JSON)JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeString(std::string const& utf8)
{
    return {std::make_unique<JSON_string>(utf8)};
}